

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::CheckPlanes(FFlatVertexBuffer *this,sector_t *sector)

{
  if (sector->planes[1].TexZ != sector->vboheight[1]) {
    UpdatePlaneVertices(this,sector,1);
    sector->vboheight[1] = sector->planes[1].TexZ;
  }
  if (sector->planes[0].TexZ != sector->vboheight[0]) {
    UpdatePlaneVertices(this,sector,0);
    sector->vboheight[0] = sector->planes[0].TexZ;
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CheckPlanes(sector_t *sector)
{
	if (sector->GetPlaneTexZ(sector_t::ceiling) != sector->vboheight[sector_t::ceiling])
	{
		UpdatePlaneVertices(sector, sector_t::ceiling);
		sector->vboheight[sector_t::ceiling] = sector->GetPlaneTexZ(sector_t::ceiling);
	}
	if (sector->GetPlaneTexZ(sector_t::floor) != sector->vboheight[sector_t::floor])
	{
		UpdatePlaneVertices(sector, sector_t::floor);
		sector->vboheight[sector_t::floor] = sector->GetPlaneTexZ(sector_t::floor);
	}
}